

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall
btQuantizedBvh::deSerializeDouble
          (btQuantizedBvh *this,btQuantizedBvhDoubleData *quantizedBvhDoubleData)

{
  uint uVar1;
  btOptimizedBvhNode *pbVar2;
  btQuantizedBvhNodeData *pbVar3;
  btQuantizedBvhNode *pbVar4;
  btBvhSubtreeInfoData *pbVar5;
  int *piVar6;
  btOptimizedBvhNodeDoubleData *dataIn;
  ulong uVar7;
  ulong uVar8;
  btOptimizedBvhNode local_68;
  
  btVector3::deSerializeDouble(&this->m_bvhAabbMax,&quantizedBvhDoubleData->m_bvhAabbMax);
  btVector3::deSerializeDouble(&this->m_bvhAabbMin,&quantizedBvhDoubleData->m_bvhAabbMin);
  btVector3::deSerializeDouble(&this->m_bvhQuantization,&quantizedBvhDoubleData->m_bvhQuantization);
  this->m_curNodeIndex = quantizedBvhDoubleData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhDoubleData->m_useQuantization != 0;
  uVar1 = quantizedBvhDoubleData->m_numContiguousLeafNodes;
  local_68.m_padding[4] = '\0';
  local_68.m_padding[5] = '\0';
  local_68.m_padding[6] = '\0';
  local_68.m_padding[7] = '\0';
  local_68.m_padding[8] = '\0';
  local_68.m_padding[9] = '\0';
  local_68.m_padding[10] = '\0';
  local_68.m_padding[0xb] = '\0';
  local_68.m_padding[0xc] = '\0';
  local_68.m_padding[0xd] = '\0';
  local_68.m_padding[0xe] = '\0';
  local_68.m_padding[0xf] = '\0';
  local_68.m_padding[0x10] = '\0';
  local_68.m_padding[0x11] = '\0';
  local_68.m_padding[0x12] = '\0';
  local_68.m_padding[0x13] = '\0';
  local_68.m_escapeIndex = 0;
  local_68.m_subPart = 0;
  local_68.m_triangleIndex = 0;
  local_68.m_padding[0] = '\0';
  local_68.m_padding[1] = '\0';
  local_68.m_padding[2] = '\0';
  local_68.m_padding[3] = '\0';
  local_68.m_aabbMaxOrg.m_floats[0] = 0.0;
  local_68.m_aabbMaxOrg.m_floats[1] = 0.0;
  local_68.m_aabbMaxOrg.m_floats[2] = 0.0;
  local_68.m_aabbMaxOrg.m_floats[3] = 0.0;
  local_68.m_aabbMinOrg.m_floats[0] = 0.0;
  local_68.m_aabbMinOrg.m_floats[1] = 0.0;
  local_68.m_aabbMinOrg.m_floats[2] = 0.0;
  local_68.m_aabbMinOrg.m_floats[3] = 0.0;
  btAlignedObjectArray<btOptimizedBvhNode>::resize(&this->m_contiguousNodes,uVar1,&local_68);
  if (uVar1 != 0) {
    dataIn = quantizedBvhDoubleData->m_contiguousNodesPtr;
    uVar7 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 * 0x40 != uVar7; uVar7 = uVar7 + 0x40) {
      btVector3::deSerializeDouble
                ((btVector3 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + uVar7),
                 &dataIn->m_aabbMaxOrg);
      btVector3::deSerializeDouble
                ((btVector3 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + uVar7),
                 &dataIn->m_aabbMinOrg);
      pbVar2 = (this->m_contiguousNodes).m_data;
      *(undefined8 *)(pbVar2->m_padding + (uVar7 - 0xc)) = *(undefined8 *)&dataIn->m_escapeIndex;
      *(int *)(pbVar2->m_padding + (uVar7 - 4)) = dataIn->m_triangleIndex;
      dataIn = dataIn + 1;
    }
  }
  uVar1 = quantizedBvhDoubleData->m_numQuantizedContiguousNodes;
  local_68.m_aabbMinOrg.m_floats[0] = 0.0;
  local_68.m_aabbMinOrg.m_floats[1] = 0.0;
  local_68.m_aabbMinOrg.m_floats[2] = 0.0;
  local_68.m_aabbMinOrg.m_floats[3] = 0.0;
  btAlignedObjectArray<btQuantizedBvhNode>::resize
            (&this->m_quantizedContiguousNodes,uVar1,(btQuantizedBvhNode *)&local_68);
  if (uVar1 != 0) {
    pbVar3 = quantizedBvhDoubleData->m_quantizedContiguousNodesPtr;
    pbVar4 = (this->m_quantizedContiguousNodes).m_data;
    uVar7 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
      *(undefined4 *)((long)pbVar4->m_quantizedAabbMax + uVar7 + 6) =
           *(undefined4 *)((long)pbVar3->m_quantizedAabbMax + uVar7 + 6);
      *(undefined2 *)((long)pbVar4->m_quantizedAabbMax + uVar7) =
           *(undefined2 *)((long)pbVar3->m_quantizedAabbMax + uVar7);
      *(undefined2 *)((long)pbVar4->m_quantizedAabbMax + uVar7 + 2) =
           *(undefined2 *)((long)pbVar3->m_quantizedAabbMax + uVar7 + 2);
      *(undefined2 *)((long)pbVar4->m_quantizedAabbMax + uVar7 + 4) =
           *(undefined2 *)((long)pbVar3->m_quantizedAabbMax + uVar7 + 4);
      *(undefined2 *)((long)pbVar4->m_quantizedAabbMin + uVar7) =
           *(undefined2 *)((long)pbVar3->m_quantizedAabbMin + uVar7);
      *(undefined2 *)((long)pbVar4->m_quantizedAabbMin + uVar7 + 2) =
           *(undefined2 *)((long)pbVar3->m_quantizedAabbMin + uVar7 + 2);
      *(undefined2 *)((long)pbVar4->m_quantizedAabbMin + uVar7 + 4) =
           *(undefined2 *)((long)pbVar3->m_quantizedAabbMin + uVar7 + 4);
    }
  }
  this->m_traversalMode = quantizedBvhDoubleData->m_traversalMode;
  uVar1 = quantizedBvhDoubleData->m_numSubtreeHeaders;
  btAlignedObjectArray<btBvhSubtreeInfo>::resize
            (&this->m_SubtreeHeaders,uVar1,(btBvhSubtreeInfo *)&local_68);
  if (uVar1 != 0) {
    pbVar5 = quantizedBvhDoubleData->m_subTreeInfoPtr;
    uVar7 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar7;
    }
    piVar6 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    for (; uVar8 * 0x14 - uVar7 != 0; uVar7 = uVar7 + 0x14) {
      *(unsigned_short *)((long)piVar6 + -6) =
           *(unsigned_short *)((long)pbVar5->m_quantizedAabbMax + uVar7);
      *(unsigned_short *)(piVar6 + -1) =
           *(unsigned_short *)((long)pbVar5->m_quantizedAabbMax + uVar7 + 2);
      *(unsigned_short *)((long)piVar6 + -2) =
           *(unsigned_short *)((long)pbVar5->m_quantizedAabbMax + uVar7 + 4);
      ((btBvhSubtreeInfo *)(piVar6 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pbVar5->m_quantizedAabbMin + uVar7);
      *(unsigned_short *)((long)piVar6 + -10) =
           *(unsigned_short *)((long)pbVar5->m_quantizedAabbMin + uVar7 + 2);
      *(unsigned_short *)(piVar6 + -2) =
           *(unsigned_short *)((long)pbVar5->m_quantizedAabbMin + uVar7 + 4);
      *(undefined8 *)piVar6 = *(undefined8 *)((long)pbVar5->m_quantizedAabbMin + (uVar7 - 8));
      piVar6 = piVar6 + 8;
    }
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeDouble(struct btQuantizedBvhDoubleData& quantizedBvhDoubleData)
{
	m_bvhAabbMax.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeDouble(quantizedBvhDoubleData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhDoubleData.m_curNodeIndex;
	m_useQuantization = quantizedBvhDoubleData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhDoubleData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeDoubleData* memPtr = quantizedBvhDoubleData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeDouble(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeDouble(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhDoubleData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhDoubleData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhDoubleData.m_traversalMode);
	
	{
		int numElem = quantizedBvhDoubleData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhDoubleData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}

}